

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_io_util.hpp
# Opt level: O0

bool file_io::is_frontmatter_tag(string *__line)

{
  bool bVar1;
  undefined1 local_38 [8];
  regex __frontmatter_tags;
  string *__line_local;
  
  __frontmatter_tags._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__line;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_38,
             "^\\s*(?:---|\\+\\+\\+|\\{|\\})\\s*$",0x10);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (__line,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_38,0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_38);
  return bVar1;
}

Assistant:

bool is_frontmatter_tag(std::string __line) {
		std::regex __frontmatter_tags("^\\s*(?:---|\\+\\+\\+|\\{|\\})\\s*$");
		if (std::regex_match(__line, __frontmatter_tags))
			return true;
		else
			return false;
	}